

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

int sc_jsf(int *u0,int *u1,limb_t *a,limb_t *b)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  lVar9 = 0;
  uVar2 = 0;
  uVar8 = 0;
  iVar10 = 0;
  do {
    iVar11 = iVar10;
    uVar8 = uVar8 + a[lVar9];
    uVar2 = uVar2 + b[lVar9];
    iVar10 = 0;
    do {
      iVar5 = 0;
      iVar4 = 0;
      uVar12 = (uint)uVar8 & 3;
      uVar6 = (uint)uVar2;
      if ((uVar8 & 3) != 0) {
        uVar3 = (uint)uVar8 & 7;
        if (((uVar3 == 5) || (uVar3 == 3)) && ((uVar6 & 3) == 2)) {
          iVar4 = uVar12 - 2;
        }
        else {
          iVar4 = 2 - uVar12;
        }
      }
      iVar13 = iVar11 + iVar10;
      u0[iVar13] = iVar4;
      if ((uVar2 & 3) != 0) {
        if ((((uVar6 & 7) == 5) || ((uVar6 & 7) == 3)) && (uVar12 == 2)) {
          iVar5 = (uVar6 & 3) - 2;
        }
        else {
          iVar5 = 2 - (uVar6 & 3);
        }
      }
      u1[iVar13] = iVar5;
      uVar8 = (long)(uVar8 - (long)u0[iVar13]) >> 1;
      uVar2 = (long)(uVar2 - (long)iVar5) >> 1;
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0x34);
    lVar9 = lVar9 + 1;
    iVar10 = iVar11 + 0x34;
  } while (lVar9 != 5);
  uVar3 = (uint)uVar8 & 3;
  uVar6 = iVar11 + 0x34;
  iVar11 = 0;
  iVar10 = 0;
  uVar12 = (uint)uVar2;
  if ((uVar8 & 3) != 0) {
    uVar7 = (uint)uVar8 & 7;
    if (((uVar7 == 5) || (uVar7 == 3)) && ((uVar12 & 3) == 2)) {
      iVar10 = uVar3 - 2;
    }
    else {
      iVar10 = 2 - uVar3;
    }
  }
  u0[(int)uVar6] = iVar10;
  if ((uVar2 & 3) != 0) {
    if ((((uVar12 & 7) == 5) || ((uVar12 & 7) == 3)) && (uVar3 == 2)) {
      iVar11 = (uVar12 & 3) - 2;
    }
    else {
      iVar11 = 2 - (uVar12 & 3);
    }
  }
  u1[(int)uVar6] = iVar11;
  uVar12 = uVar6;
  if (-1 < (int)uVar6) {
    do {
      if (u0[uVar12] != 0) {
        return uVar12;
      }
      if (u1[uVar12] != 0) {
        return uVar12;
      }
      uVar6 = uVar12 - 1;
      bVar1 = 0 < (int)uVar12;
      uVar12 = uVar6;
    } while (bVar1);
  }
  return uVar6;
}

Assistant:

int
sc_jsf(int u0[SC_BITS+1], int u1[SC_BITS+1], const sc_t a, const sc_t b)
{
	limb_t n0, n1;
	int i, j, k;

	k = n0 = n1 = 0;

	for (i = 0; i < K; i++) {
		n0 += a[i];
		n1 += b[i];

		for (j = 0; j < LB; j++, k++) {
			u0[k] = jsfdigit(n0, n1);
			u1[k] = jsfdigit(n1, n0);

			n0 = (n0 - u0[k]) >> 1;
			n1 = (n1 - u1[k]) >> 1;
		}
	}
	u0[k] = jsfdigit(n0, n1);
	u1[k] = jsfdigit(n1, n0);

	while (k >= 0 && u0[k] == 0 && u1[k] == 0)
		k--;

	return k;
}